

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edition_unittest.pb.cc
# Opt level: O0

void __thiscall
edition_unittest::TestOneof2::set_allocated_foo_message
          (TestOneof2 *this,TestOneof2_NestedMessage *foo_message)

{
  Arena *message_arena_00;
  Arena *submessage_arena_00;
  Arena *submessage_arena;
  Arena *message_arena;
  TestOneof2_NestedMessage *foo_message_local;
  TestOneof2 *this_local;
  
  message_arena_00 = google::protobuf::MessageLite::GetArena((MessageLite *)this);
  clear_foo(this);
  if (foo_message != (TestOneof2_NestedMessage *)0x0) {
    submessage_arena_00 = google::protobuf::MessageLite::GetArena((MessageLite *)foo_message);
    message_arena = (Arena *)foo_message;
    if (message_arena_00 != submessage_arena_00) {
      message_arena =
           (Arena *)google::protobuf::internal::
                    GetOwnedMessage<edition_unittest::TestOneof2_NestedMessage>
                              (message_arena_00,foo_message,submessage_arena_00);
    }
    set_has_foo_message(this);
    (this->field_0)._impl_.foo_.foo_message_ = (Message *)message_arena;
  }
  return;
}

Assistant:

void TestOneof2::set_allocated_foo_message(::edition_unittest::TestOneof2_NestedMessage* PROTOBUF_NULLABLE foo_message) {
  ::google::protobuf::Arena* message_arena = GetArena();
  clear_foo();
  if (foo_message) {
    ::google::protobuf::Arena* submessage_arena = foo_message->GetArena();
    if (message_arena != submessage_arena) {
      foo_message = ::google::protobuf::internal::GetOwnedMessage(message_arena, foo_message, submessage_arena);
    }
    set_has_foo_message();
    _impl_.foo_.foo_message_ = foo_message;
  }
  // @@protoc_insertion_point(field_set_allocated:edition_unittest.TestOneof2.foo_message)
}